

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Status __thiscall leveldb::anon_unknown_1::PosixWritableFile::Close(PosixWritableFile *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  Status *this_00;
  long in_RSI;
  PosixWritableFile *in_RDI;
  long in_FS_OFFSET;
  int close_result;
  Status *status;
  Status *in_stack_ffffffffffffff98;
  Status *in_stack_ffffffffffffffa0;
  PosixWritableFile *context;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  context = in_RDI;
  FlushBuffer(in_RDI);
  iVar3 = close(*(int *)(in_RSI + 0x10010));
  if ((iVar3 < 0) && (bVar2 = Status::ok(in_stack_ffffffffffffff98), bVar2)) {
    this_00 = (Status *)(in_RSI + 0x10018);
    __errno_location();
    PosixError((string *)context,(int)((ulong)this_00 >> 0x20));
    Status::operator=(this_00,in_stack_ffffffffffffffa0);
    Status::~Status(in_stack_ffffffffffffff98);
  }
  *(undefined4 *)(in_RSI + 0x10010) = 0xffffffff;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (Status)(char *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

Status Close() override {
    Status status = FlushBuffer();
    const int close_result = ::close(fd_);
    if (close_result < 0 && status.ok()) {
      status = PosixError(filename_, errno);
    }
    fd_ = -1;
    return status;
  }